

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regcomp.c
# Opt level: O3

void doemit(parse *p,sop op,size_t opnd)

{
  long lVar1;
  long lVar2;
  
  if (p->error != 0) {
    return;
  }
  lVar1 = p->ssize;
  lVar2 = p->slen;
  if (lVar1 <= lVar2) {
    enlarge(p,((lVar1 - (lVar1 + 1 >> 0x3f)) + 1 >> 1) * 3);
    lVar2 = p->slen;
  }
  p->slen = lVar2 + 1;
  p->strip[lVar2] = opnd | op;
  return;
}

Assistant:

static void
doemit(p, op, opnd)
register struct parse *p;
sop op;
size_t opnd;
{
	/* avoid making error situations worse */
	if (p->error != 0)
		return;

	/* deal with oversize operands ("can't happen", more or less) */
	assert(opnd < 1<<OPSHIFT);

	/* deal with undersized strip */
	if (p->slen >= p->ssize)
		enlarge(p, (p->ssize+1) / 2 * 3);	/* +50% */
	assert(p->slen < p->ssize);

	/* finally, it's all reduced to the easy case */
	p->strip[p->slen++] = SOP(op, (sop) opnd);
}